

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

TypedVector * __thiscall flexbuffers::Map::Keys(TypedVector *__return_storage_ptr__,Map *this)

{
  uint8_t *puVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  
  bVar3 = (this->super_Vector).super_Sized.super_Object.byte_width_;
  uVar2 = (ulong)bVar3;
  puVar5 = (ulong *)((this->super_Vector).super_Sized.super_Object.data_ + uVar2 * -3);
  if (uVar2 < 4) {
    if (bVar3 < 2) {
      uVar7 = (ulong)(byte)*puVar5;
    }
    else {
      uVar7 = (ulong)(ushort)*puVar5;
    }
  }
  else if (bVar3 < 8) {
    uVar7 = (ulong)(uint)*puVar5;
  }
  else {
    uVar7 = *puVar5;
  }
  puVar1 = (uint8_t *)((long)puVar5 - uVar7);
  if (bVar3 < 4) {
    if (1 < bVar3) {
      uVar4 = (uint)*(ushort *)((long)puVar5 + uVar2);
      goto LAB_0014de6d;
    }
  }
  else if (bVar3 < 8) {
    uVar4 = *(uint *)((long)puVar5 + uVar2);
    goto LAB_0014de6d;
  }
  uVar4 = (uint)*(byte *)((long)puVar5 + uVar2);
LAB_0014de6d:
  (__return_storage_ptr__->super_Sized).super_Object.data_ = puVar1;
  bVar3 = (byte)uVar4;
  (__return_storage_ptr__->super_Sized).super_Object.byte_width_ = bVar3;
  lVar6 = -(ulong)(uVar4 & 0xff);
  if (bVar3 < 4) {
    if (bVar3 < 2) {
      uVar2 = (ulong)puVar1[lVar6];
    }
    else {
      uVar2 = (ulong)*(ushort *)(puVar1 + lVar6);
    }
  }
  else if (bVar3 < 8) {
    uVar2 = (ulong)*(uint *)(puVar1 + lVar6);
  }
  else {
    uVar2 = *(ulong *)(puVar1 + lVar6);
  }
  (__return_storage_ptr__->super_Sized).size_ = uVar2;
  __return_storage_ptr__->type_ = FBT_KEY;
  return __return_storage_ptr__;
}

Assistant:

TypedVector Keys() const {
    const size_t num_prefixed_fields = 3;
    auto keys_offset = data_ - byte_width_ * num_prefixed_fields;
    return TypedVector(Indirect(keys_offset, byte_width_),
                       static_cast<uint8_t>(
                           ReadUInt64(keys_offset + byte_width_, byte_width_)),
                       FBT_KEY);
  }